

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void set_partial_sb_partition
               (AV1_COMMON *cm,MB_MODE_INFO *mi,int bh_in,int bw_in,int mi_rows_remaining,
               int mi_cols_remaining,BLOCK_SIZE bsize,MB_MODE_INFO **mib)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int mi_index;
  int grid_index;
  int bw;
  int c;
  int r;
  int bh;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  long local_10;
  long local_8;
  
  local_24 = in_EDX;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < *(int *)(*(long *)(local_8 + 0x6088) + 0x20);
      local_28 = local_24 + local_28) {
    local_30 = local_18;
    for (local_2c = 0; local_2c < *(int *)(*(long *)(local_8 + 0x6088) + 0x20);
        local_2c = local_30 + local_2c) {
      iVar2 = get_mi_grid_idx((CommonModeInfoParams *)(local_8 + 0x208),local_28,local_2c);
      iVar3 = get_alloc_mi_idx((CommonModeInfoParams *)(local_8 + 0x208),local_28,local_2c);
      *(long *)(_r + (long)iVar2 * 8) = local_10 + (long)iVar3 * 0xb0;
      BVar1 = find_partition_size((BLOCK_SIZE)bw,local_1c - local_28,local_20 - local_2c,&local_24,
                                  &local_30);
      **(BLOCK_SIZE **)(_r + (long)iVar2 * 8) = BVar1;
    }
  }
  return;
}

Assistant:

static void set_partial_sb_partition(const AV1_COMMON *const cm,
                                     MB_MODE_INFO *mi, int bh_in, int bw_in,
                                     int mi_rows_remaining,
                                     int mi_cols_remaining, BLOCK_SIZE bsize,
                                     MB_MODE_INFO **mib) {
  int bh = bh_in;
  int r, c;
  for (r = 0; r < cm->seq_params->mib_size; r += bh) {
    int bw = bw_in;
    for (c = 0; c < cm->seq_params->mib_size; c += bw) {
      const int grid_index = get_mi_grid_idx(&cm->mi_params, r, c);
      const int mi_index = get_alloc_mi_idx(&cm->mi_params, r, c);
      mib[grid_index] = mi + mi_index;
      mib[grid_index]->bsize = find_partition_size(
          bsize, mi_rows_remaining - r, mi_cols_remaining - c, &bh, &bw);
    }
  }
}